

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32_hw.c
# Opt level: O0

uint32_t crc32c_hw(void *input,int len,uint32_t crc)

{
  undefined8 uVar1;
  char *buf;
  uint32_t crc_local;
  int len_local;
  void *input_local;
  
  crc_local = crc ^ 0xffffffff;
  buf = (char *)input;
  for (len_local = len; 0 < len_local && ((ulong)buf & 7) != 0; len_local = len_local + -1) {
    crc_local = crc32(crc_local,*buf);
    buf = buf + 1;
  }
  for (; 7 < (uint)len_local; len_local = len_local + -8) {
    uVar1 = crc32((ulong)crc_local,*(undefined8 *)buf);
    crc_local = (uint32_t)uVar1;
    buf = buf + 8;
  }
  for (; 3 < (uint)len_local; len_local = len_local + -4) {
    crc_local = crc32(crc_local,*(undefined4 *)buf);
    buf = buf + 4;
  }
  for (; 1 < (uint)len_local; len_local = len_local + -2) {
    crc_local = crc32(crc_local,*(undefined2 *)buf);
    buf = buf + 2;
  }
  for (; len_local != 0; len_local = len_local + -1) {
    crc_local = crc32(crc_local,*buf);
    buf = buf + 1;
  }
  return crc_local ^ 0xffffffff;
}

Assistant:

uint32_t crc32c_hw(const void *input, int len, uint32_t crc)
{
    const char* buf = (const char*)input;

    // XOR the initial CRC with INT_MAX
    crc ^= 0xFFFFFFFF;

    // Align the input to the word boundary
    for (; (len > 0) && ((size_t)buf & ALIGN_MASK); len--, buf++) {
        crc = _mm_crc32_u8(crc, *buf);
    }

    // Blast off the CRC32 calculation
#ifdef __x86_64__
    CALC_CRC(_mm_crc32_u64, crc, uint64_t, buf, len);
#endif
    CALC_CRC(_mm_crc32_u32, crc, uint32_t, buf, len);
    CALC_CRC(_mm_crc32_u16, crc, uint16_t, buf, len);
    CALC_CRC(_mm_crc32_u8, crc, uint8_t, buf, len);

    // Post-process the crc
    return (crc ^ 0xFFFFFFFF);
}